

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O2

SObjMtl * __thiscall
irr::scene::COBJMeshFileLoader::findMtl(COBJMeshFileLoader *this,stringc *mtlName,stringc *grpName)

{
  undefined1 *this_00;
  __type _Var1;
  SObjMtl *this_01;
  undefined8 *puVar2;
  long lVar3;
  u32 i;
  ulong uVar4;
  SObjMtl *local_40;
  SObjMtl *local_38;
  
  this_00 = &(this->super_IMeshLoader).field_0x10;
  lVar3 = 0;
  uVar4 = 0;
  local_40 = (SObjMtl *)0x0;
  do {
    puVar2 = *(undefined8 **)&(this->super_IMeshLoader).field_0x10;
    if (((ulong)(*(long *)&(this->super_IMeshLoader).field_0x18 - (long)puVar2) >> 3 & 0xffffffff)
        <= uVar4) {
      if (local_40 == (SObjMtl *)0x0) {
        if ((int)(grpName->str)._M_string_length == 0) {
          return (SObjMtl *)0x0;
        }
        this_01 = (SObjMtl *)operator_new(0x80);
        local_40 = (SObjMtl *)*puVar2;
      }
      else {
        this_01 = (SObjMtl *)operator_new(0x80);
      }
      SObjMtl::SObjMtl(this_01,local_40);
      local_38 = this_01;
      core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::push_back
                ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)this_00,&local_38);
      core::string<char>::operator=
                ((string<char> *)
                 (*(long *)(*(long *)&(this->super_IMeshLoader).field_0x18 + -8) + 0x58),grpName);
      puVar2 = (undefined8 *)(*(long *)&(this->super_IMeshLoader).field_0x18 + -8);
LAB_001d9c3e:
      return (SObjMtl *)*puVar2;
    }
    _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)((long)puVar2 + lVar3) + 0x38),&mtlName->str);
    if (_Var1) {
      _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(*(long *)(*(long *)this_00 + lVar3) + 0x58),&grpName->str);
      if (_Var1) {
        puVar2 = (undefined8 *)(*(long *)this_00 + lVar3);
        goto LAB_001d9c3e;
      }
      local_40 = *(SObjMtl **)(*(long *)this_00 + lVar3);
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 8;
  } while( true );
}

Assistant:

COBJMeshFileLoader::SObjMtl *COBJMeshFileLoader::findMtl(const core::stringc &mtlName, const core::stringc &grpName)
{
	COBJMeshFileLoader::SObjMtl *defMaterial = 0;
	// search existing Materials for best match
	// exact match does return immediately, only name match means a new group
	for (u32 i = 0; i < Materials.size(); ++i) {
		if (Materials[i]->Name == mtlName) {
			if (Materials[i]->Group == grpName)
				return Materials[i];
			else
				defMaterial = Materials[i];
		}
	}
	// we found a partial match
	if (defMaterial) {
		Materials.push_back(new SObjMtl(*defMaterial));
		Materials.getLast()->Group = grpName;
		return Materials.getLast();
	}
	// we found a new group for a non-existent material
	else if (grpName.size()) {
		Materials.push_back(new SObjMtl(*Materials[0]));
		Materials.getLast()->Group = grpName;
		return Materials.getLast();
	}
	return 0;
}